

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeBufferBindingCase::test
          (VertexAttributeBufferBindingCase *this)

{
  CallLogWrapper *gl;
  TestLog *pTVar1;
  GLenum in_R8D;
  GLenum GVar2;
  allocator<char> local_6a;
  allocator<char> local_69;
  ScopedLogSection section;
  GLuint bufferID;
  GLuint GStack_5c;
  GLuint bufs [2];
  
  pTVar1 = (this->super_ApiCase).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&bufferID,"DefaultVAO",&local_69);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)bufs,"Test with default VAO",&local_6a);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&bufferID,(string *)bufs);
  std::__cxx11::string::~string((string *)bufs);
  std::__cxx11::string::~string((string *)&bufferID);
  gl = &(this->super_ApiCase).super_CallLogWrapper;
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x889f,0,in_R8D);
  glu::CallLogWrapper::glGenBuffers(gl,1,&bufferID);
  glu::CallLogWrapper::glBindBuffer(gl,0x8892,bufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar2 = 0;
  glu::CallLogWrapper::glVertexAttribPointer(gl,0,4,0x1406,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x889f,bufferID,GVar2);
  glu::CallLogWrapper::glDeleteBuffers(gl,1,&bufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = (this->super_ApiCase).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&bufferID,"WithVAO",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)bufs,"Test with VAO",&local_6a);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&bufferID,(string *)bufs);
  std::__cxx11::string::~string((string *)bufs);
  std::__cxx11::string::~string((string *)&bufferID);
  _bufferID = (pointer)0x0;
  bufs[0] = 0;
  bufs[1] = 0;
  glu::CallLogWrapper::glGenBuffers(gl,2,bufs);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glGenVertexArrays(gl,2,&bufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(gl,bufferID);
  glu::CallLogWrapper::glBindBuffer(gl,0x8892,bufs[0]);
  glu::CallLogWrapper::glVertexAttribPointer(gl,0,4,0x1406,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(gl,GStack_5c);
  glu::CallLogWrapper::glBindBuffer(gl,0x8892,bufs[1]);
  GVar2 = 0;
  glu::CallLogWrapper::glVertexAttribPointer(gl,0,4,0x1406,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x889f,bufs[1],GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(gl,bufferID);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x889f,bufs[0],GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(gl,2,&bufferID);
  glu::CallLogWrapper::glDeleteBuffers(gl,2,bufs);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return;
}

Assistant:

void test (void)
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			// initial
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, 0);

			GLuint bufferID;
			glGenBuffers(1, &bufferID);
			glBindBuffer(GL_ARRAY_BUFFER, bufferID);
			expectError(GL_NO_ERROR);

			glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, bufferID);

			glDeleteBuffers(1, &bufferID);
			expectError(GL_NO_ERROR);
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint vaos[2] = {0};
			GLuint bufs[2] = {0};

			glGenBuffers(2, bufs);
			expectError(GL_NO_ERROR);

			glGenVertexArrays(2, vaos);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glBindVertexArray(vaos[0]);
			glBindBuffer(GL_ARRAY_BUFFER, bufs[0]);
			glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glBindBuffer(GL_ARRAY_BUFFER, bufs[1]);
			glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, bufs[1]);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, bufs[0]);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(2, bufs);
			expectError(GL_NO_ERROR);
		}
	}